

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O2

void * evthread_setup_global_lock_(void *lock_,uint locktype,int enable_locks)

{
  void *pvVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (original_lock_fns_.alloc == (_func_void_ptr_uint *)0x0 && enable_locks == 0) {
    if (lock_ == (void *)0x0) {
LAB_001c97a0:
      pvVar1 = debug_lock_alloc(locktype);
      return pvVar1;
    }
    pcVar3 = "lock_ == NULL";
    uVar2 = 0x178;
  }
  else if (original_lock_fns_.alloc == (_func_void_ptr_uint *)0x0 || enable_locks != 0) {
    if (evthread_lock_debugging_enabled_ == 0 && enable_locks != 0) {
      if (lock_ == (void *)0x0) {
        pvVar1 = (*evthread_lock_fns_.alloc)(locktype);
        return pvVar1;
      }
      pcVar3 = "lock_ == NULL";
      uVar2 = 400;
    }
    else {
      if (lock_ == (void *)0x0) {
        lock_ = debug_lock_alloc(locktype);
      }
      if ((enable_locks == 0) || (evthread_lock_debugging_enabled_ == 0)) {
        pcVar3 = "enable_locks && evthread_lock_debugging_enabled_";
        uVar2 = 0x196;
      }
      else {
        if (*(uint *)((long)lock_ + 4) == locktype) {
          if (*(long *)((long)lock_ + 0x18) != 0) {
            return lock_;
          }
          pvVar1 = (*original_lock_fns_.alloc)(locktype | 1);
          *(void **)((long)lock_ + 0x18) = pvVar1;
          if (pvVar1 == (void *)0x0) {
            *(undefined4 *)((long)lock_ + 0x10) = 0xffffff38;
            event_mm_free_(lock_);
            return (void *)0x0;
          }
          return lock_;
        }
        pcVar3 = "lock->locktype == locktype";
        uVar2 = 0x197;
      }
    }
  }
  else {
    if (lock_ != (void *)0x0) {
      if ((locktype & 1) != 0) {
        pvVar1 = event_mm_malloc_(0x20);
        if (pvVar1 == (void *)0x0) {
          (*original_lock_fns_.free)(lock_,locktype);
          return (void *)0x0;
        }
        *(void **)((long)pvVar1 + 0x18) = lock_;
        *(uint *)((long)pvVar1 + 4) = locktype;
        *(undefined4 *)((long)pvVar1 + 0x10) = 0;
        *(undefined8 *)((long)pvVar1 + 8) = 0;
        return pvVar1;
      }
      (*original_lock_fns_.free)(lock_,locktype);
      goto LAB_001c97a0;
    }
    pcVar3 = "lock_ != NULL";
    uVar2 = 0x17d;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
             ,uVar2,pcVar3,"evthread_setup_global_lock_");
}

Assistant:

void *
evthread_setup_global_lock_(void *lock_, unsigned locktype, int enable_locks)
{
	/* there are four cases here:
	   1) we're turning on debugging; locking is not on.
	   2) we're turning on debugging; locking is on.
	   3) we're turning on locking; debugging is not on.
	   4) we're turning on locking; debugging is on. */

	if (!enable_locks && original_lock_fns_.alloc == NULL) {
		/* Case 1: allocate a debug lock. */
		EVUTIL_ASSERT(lock_ == NULL);
		return debug_lock_alloc(locktype);
	} else if (!enable_locks && original_lock_fns_.alloc != NULL) {
		/* Case 2: wrap the lock in a debug lock. */
		struct debug_lock *lock;
		EVUTIL_ASSERT(lock_ != NULL);

		if (!(locktype & EVTHREAD_LOCKTYPE_RECURSIVE)) {
			/* We can't wrap it: We need a recursive lock */
			original_lock_fns_.free(lock_, locktype);
			return debug_lock_alloc(locktype);
		}
		lock = mm_malloc(sizeof(struct debug_lock));
		if (!lock) {
			original_lock_fns_.free(lock_, locktype);
			return NULL;
		}
		lock->lock = lock_;
		lock->locktype = locktype;
		lock->count = 0;
		lock->held_by = 0;
		return lock;
	} else if (enable_locks && ! evthread_lock_debugging_enabled_) {
		/* Case 3: allocate a regular lock */
		EVUTIL_ASSERT(lock_ == NULL);
		return evthread_lock_fns_.alloc(locktype);
	} else {
		/* Case 4: Fill in a debug lock with a real lock */
		struct debug_lock *lock = lock_ ? lock_ : debug_lock_alloc(locktype);
		EVUTIL_ASSERT(enable_locks &&
		              evthread_lock_debugging_enabled_);
		EVUTIL_ASSERT(lock->locktype == locktype);
		if (!lock->lock) {
			lock->lock = original_lock_fns_.alloc(
				locktype|EVTHREAD_LOCKTYPE_RECURSIVE);
			if (!lock->lock) {
				lock->count = -200;
				mm_free(lock);
				return NULL;
			}
		}
		return lock;
	}
}